

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O1

void absl::anon_unknown_2::DivModImpl
               (uint128 dividend,uint128 divisor,uint128 *quotient_ret,uint128 *remainder_ret)

{
  ulong uVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  uint64_t uVar15;
  
  uVar5 = divisor.hi_;
  uVar8 = divisor.lo_;
  uVar11 = dividend.hi_;
  uVar12 = dividend.lo_;
  if (uVar8 == 0 && uVar5 == 0) {
    __assert_fail("divisor != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                  ,0x3a,
                  "void absl::(anonymous namespace)::DivModImpl(uint128, uint128, uint128 *, uint128 *)"
                 );
  }
  if (uVar11 < uVar5 || uVar11 - uVar5 < (ulong)(uVar12 < uVar8)) {
    quotient_ret->lo_ = 0;
    quotient_ret->hi_ = 0;
  }
  else {
    if (uVar5 == uVar11 && uVar8 == uVar12) {
      quotient_ret->lo_ = 1;
      quotient_ret->hi_ = 0;
      remainder_ret->lo_ = 0;
      remainder_ret->hi_ = 0;
      return;
    }
    if (uVar11 == 0) {
      uVar6 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar6 = (uint)lVar2 ^ 0x3f;
    }
    if (uVar11 == 0) {
      if (uVar12 == 0) goto LAB_00158de5;
      lVar2 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar6 = (uint)lVar2;
    }
    else {
      uVar6 = uVar6 ^ 0x7f;
    }
    if (uVar5 == 0) {
      uVar13 = 0x40;
    }
    else {
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar13 = (uint)lVar2 ^ 0x3f;
    }
    if (uVar5 == 0) {
      if (uVar8 == 0) {
LAB_00158de5:
        __assert_fail("low != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/numeric/int128.cc"
                      ,0x31,"int absl::(anonymous namespace)::Fls128(uint128)");
      }
      lVar2 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar13 = (uint)lVar2;
    }
    else {
      uVar13 = uVar13 ^ 0x7f;
    }
    uVar6 = uVar6 - uVar13;
    if ((int)uVar6 < 0) {
      uVar15 = 0;
      uVar14 = 0;
    }
    else {
      bVar3 = (byte)uVar6 & 0x3f;
      uVar9 = uVar8 << ((byte)uVar6 & 0x3f);
      uVar14 = 0;
      uVar10 = uVar9;
      uVar5 = uVar5 << bVar3 | uVar8 >> 0x40 - bVar3;
      if ((uVar6 & 0x40) != 0) {
        uVar10 = uVar14;
        uVar5 = uVar9;
      }
      iVar7 = uVar6 + 1;
      uVar15 = 0;
      uVar8 = uVar11;
      do {
        uVar14 = uVar14 << 1 | uVar15 >> 0x3f;
        uVar9 = (ulong)(uVar12 < uVar10);
        uVar1 = uVar8 - uVar5;
        uVar15 = (ulong)(uVar5 <= uVar8 && uVar9 <= uVar1) + uVar15 * 2;
        uVar11 = uVar1 - uVar9;
        uVar4 = uVar12 - uVar10;
        if (uVar5 > uVar8 || uVar9 > uVar1) {
          uVar11 = uVar8;
          uVar4 = uVar12;
        }
        uVar12 = uVar4;
        uVar10 = uVar10 >> 1 | uVar5 << 0x3f;
        uVar5 = uVar5 >> 1;
        iVar7 = iVar7 + -1;
        uVar8 = uVar11;
      } while (iVar7 != 0);
    }
    quotient_ret->lo_ = uVar15;
    quotient_ret->hi_ = uVar14;
  }
  remainder_ret->lo_ = uVar12;
  remainder_ret->hi_ = uVar11;
  return;
}

Assistant:

inline void DivModImpl(uint128 dividend, uint128 divisor, uint128* quotient_ret,
                       uint128* remainder_ret) {
  assert(divisor != 0);

  if (divisor > dividend) {
    *quotient_ret = 0;
    *remainder_ret = dividend;
    return;
  }

  if (divisor == dividend) {
    *quotient_ret = 1;
    *remainder_ret = 0;
    return;
  }

  uint128 denominator = divisor;
  uint128 quotient = 0;

  // Left aligns the MSB of the denominator and the dividend.
  const int shift = Fls128(dividend) - Fls128(denominator);
  denominator <<= shift;

  // Uses shift-subtract algorithm to divide dividend by denominator. The
  // remainder will be left in dividend.
  for (int i = 0; i <= shift; ++i) {
    quotient <<= 1;
    if (dividend >= denominator) {
      dividend -= denominator;
      quotient |= 1;
    }
    denominator >>= 1;
  }

  *quotient_ret = quotient;
  *remainder_ret = dividend;
}